

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O0

void __thiscall DBaseStatusBar::DBaseStatusBar(DBaseStatusBar *this,int reltop,int hres,int vres)

{
  bool scale;
  TObjPtr<DHUDMessage> *local_48;
  int vres_local;
  int hres_local;
  int reltop_local;
  DBaseStatusBar *this_local;
  
  DObject::DObject(&this->super_DObject);
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_00a07330;
  FImageCollection::FImageCollection(&this->Images);
  local_48 = this->Messages;
  do {
    TObjPtr<DHUDMessage>::TObjPtr(local_48);
    local_48 = local_48 + 1;
  } while (local_48 != (TObjPtr<DHUDMessage> *)&this->ShowLog);
  this->CompleteBorder = false;
  this->Centering = false;
  this->FixedOrigin = false;
  this->CrosshairSize = 1.0;
  this->RelTop = reltop;
  this->Messages[0].field_0.p = (DHUDMessage *)0x0;
  this->Messages[1].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1)0x0;
  this->Messages[2].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1)0x0;
  this->Displacement = 0.0;
  this->CPlayer = (player_t *)0x0;
  this->ShowLog = false;
  this->HorizontalResolution = hres;
  this->VirticalResolution = vres;
  scale = FBoolCVar::operator_cast_to_bool(&st_scale);
  SetScaled(this,scale,false);
  return;
}

Assistant:

DBaseStatusBar::DBaseStatusBar (int reltop, int hres, int vres)
{
	CompleteBorder = false;
	Centering = false;
	FixedOrigin = false;
	CrosshairSize = 1.;
	RelTop = reltop;
	memset(Messages, 0, sizeof(Messages));
	Displacement = 0;
	CPlayer = NULL;
	ShowLog = false;
	HorizontalResolution = hres;
	VirticalResolution = vres;

	SetScaled (st_scale);
}